

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

MapcodeError
decodeExtension(DecodeRec *dec,int dividerx4,int dividery,int lon_offset4,int extremeLat32,
               int maxLon32)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  MapcodeError MVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  byte *__s;
  byte *pbVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  uVar11 = (ulong)(uint)maxLon32;
  __s = (byte *)dec->extension;
  sVar6 = strlen((char *)__s);
  MVar5 = ERR_EXTENSION_INVALID_LENGTH;
  if (sVar6 < 9) {
    iVar10 = 1;
    iVar8 = 0;
    iVar7 = 0;
    bVar4 = false;
    uVar9 = maxLon32;
    do {
      if ((ulong)*__s == 0) {
        if (iVar10 < 810000) {
          do {
            dividerx4 = dividerx4 * 0x1e;
            dividery = dividery * 0x1e;
            bVar14 = iVar10 < 27000;
            iVar10 = iVar10 * 0x1e;
          } while (bVar14);
        }
        dVar16 = (double)lon_offset4 * 810000.0 +
                 (double)((dec->coord32).lonMicroDeg << 2) * 810000.0 +
                 (double)iVar8 * (double)dividerx4;
        dVar17 = (double)dividery;
        dVar15 = (double)(dec->coord32).latMicroDeg * 810000.0 + (double)iVar7 * dVar17;
        if (bVar4) {
          (dec->zone).fminx = dVar16;
          (dec->zone).fmaxx = (double)(dividerx4 * 6) + dVar16;
          if (dividery < 0) {
            dVar15 = dVar15 + 1.0;
            (dec->zone).fminy = (double)(dividery * 5) + dVar15;
          }
          else {
            (dec->zone).fminy = dVar15;
            dVar15 = dVar15 + (double)(dividery * 5);
          }
        }
        else {
          (dec->zone).fminx = dVar16;
          (dec->zone).fmaxx = (double)dividerx4 + dVar16;
          if (dividery < 0) {
            dVar15 = dVar15 + 1.0;
            (dec->zone).fminy = dVar17 + dVar15;
          }
          else {
            (dec->zone).fminy = dVar15;
            dVar15 = dVar15 + dVar17;
          }
        }
        (dec->zone).fmaxy = dVar15;
        if ((double)maxLon32 * 3240000.0 < (dec->zone).fmaxx) {
          (dec->zone).fmaxx = (double)maxLon32 * 3240000.0;
        }
        if (dividery < 0) {
          dVar15 = (double)extremeLat32 * 810000.0;
          if ((dec->zone).fminy <= dVar15 && dVar15 != (dec->zone).fminy) {
            (dec->zone).fminy = dVar15;
          }
        }
        else if ((double)extremeLat32 * 810000.0 < (dec->zone).fmaxy) {
          (dec->zone).fmaxy = (double)extremeLat32 * 810000.0;
        }
        if ((dec->zone).fmaxx <= (dec->zone).fminx) {
          return ERR_EXTENSION_UNDECODABLE;
        }
        if ((dec->zone).fmaxy <= (dec->zone).fminy) {
          return ERR_EXTENSION_UNDECODABLE;
        }
        return ERR_OK;
      }
      pbVar13 = __s + 1;
      bVar1 = decodeChar_decode_chars[*__s];
      bVar14 = false;
      if (bVar1 != 0x1e && -1 < (char)bVar1) {
        bVar2 = *pbVar13;
        if ((ulong)bVar2 == 0) {
          bVar4 = true;
          uVar11 = 0;
          uVar9 = 0;
        }
        else {
          cVar3 = decodeChar_decode_chars[bVar2];
          bVar14 = (bVar2 & 0xdf) == 0x5a;
          if (!bVar14 && cVar3 >= '\0') {
            uVar11 = (ulong)(uint)(int)cVar3 / 6;
            uVar9 = (uint)(int)cVar3 % 6;
          }
          pbVar13 = __s + 2;
          if (bVar14 || cVar3 < '\0') {
            bVar14 = false;
            goto LAB_001d06da;
          }
        }
        iVar12 = (uint)bVar1 + (bVar1 / 5) * -5;
        iVar10 = iVar10 * 0x1e;
        iVar8 = iVar8 * 0x1e + iVar12 * 6 + uVar9;
        iVar7 = ((iVar7 * 0x1e + (uint)bVar1) - iVar12) + (int)uVar11;
        bVar14 = true;
      }
LAB_001d06da:
      __s = pbVar13;
    } while (bVar14);
    MVar5 = ERR_EXTENSION_INVALID_CHARACTER;
  }
  return MVar5;
}

Assistant:

static enum MapcodeError decodeExtension(DecodeRec *dec,
                                         int dividerx4, int dividery,
                                         const int lon_offset4,
                                         const int extremeLat32, const int maxLon32) {
    double lat1, lon4;
    const char *extrapostfix = dec->extension;
    int lon32 = 0;
    int lat32 = 0;
    int processor = 1;
    int odd = 0;
    ASSERT(dec);
    if (strlen(extrapostfix) > MAX_PRECISION_DIGITS) {
        return ERR_EXTENSION_INVALID_LENGTH;
    }
    while (*extrapostfix) {
        int column1, row1, column2, row2;
        const int c1 = decodeChar(*extrapostfix++);
        if (c1 < 0 || c1 == 30) {
            return ERR_EXTENSION_INVALID_CHARACTER;
        } // illegal extension character
        row1 = (c1 / 5);
        column1 = (c1 % 5);
        if (*extrapostfix) {
            const int c2 = decodeChar(*extrapostfix++);
            if (c2 < 0 || c2 == 30) {
                return ERR_EXTENSION_INVALID_CHARACTER;
            } // illegal extension character
            row2 = (c2 / 6);
            column2 = (c2 % 6);
        } else {
            odd = 1;
            row2 = 0;
            column2 = 0;
        }

        processor *= 30;
        lon32 = lon32 * 30 + column1 * 6 + column2;
        lat32 = lat32 * 30 + row1 * 5 + row2;
    }

    while (processor < MAX_PRECISION_FACTOR) {
        dividerx4 *= 30;
        dividery *= 30;
        processor *= 30;
    }

    lon4 = (dec->coord32.lonMicroDeg * 4 * (double) MAX_PRECISION_FACTOR) + ((lon32 * (double) dividerx4)) +
           (lon_offset4 * (double) MAX_PRECISION_FACTOR);
    lat1 = (dec->coord32.latMicroDeg * (double) MAX_PRECISION_FACTOR) + ((lat32 * (double) dividery));

    // determine the range of coordinates that are encoded to this mapcode
    if (odd) {
        setFromFractions(&dec->zone, lat1, lon4, 5 * dividery, 6 * dividerx4);
    } else {
        setFromFractions(&dec->zone, lat1, lon4, dividery, dividerx4);
    }

    // restrict the coordinate range to the extremes that were provided
    if (dec->zone.fmaxx > maxLon32 * MICROLON_TO_FRACTIONS_FACTOR) {
        dec->zone.fmaxx = maxLon32 * MICROLON_TO_FRACTIONS_FACTOR;
    }
    if (dividery >= 0) {
        if (dec->zone.fmaxy > extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR) {
            dec->zone.fmaxy = extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR;
        }
    } else {
        if (dec->zone.fminy < extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR) {
            dec->zone.fminy = extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR;
        }
    }
    if (isEmpty(&dec->zone)) {
        return ERR_EXTENSION_UNDECODABLE;
    }
    return ERR_OK;
}